

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O1

StringRef __thiscall llvm::Twine::getSingleStringRef(Twine *this)

{
  size_t sVar1;
  char *__s;
  StringRef SVar2;
  
  if ((this->RHSKind != EmptyKind) || ((3 < this->LHSKind - 3 && (this->LHSKind != EmptyKind)))) {
    __assert_fail("isSingleStringRef() &&\"This cannot be had as a single stringref!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                  ,0x1b8,"StringRef llvm::Twine::getSingleStringRef() const");
  }
  switch(this->LHSKind) {
  case EmptyKind:
    __s = (char *)0x0;
    break;
  default:
    llvm_unreachable_internal
              ("Out of sync with isSingleStringRef",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
               ,0x1ba);
  case CStringKind:
    __s = (this->LHS).cString;
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      goto LAB_00db0fbd;
    }
    break;
  case StdStringKind:
  case StringRefKind:
    __s = (char *)*(this->LHS).decUL;
    sVar1 = (this->LHS).decUL[1];
    goto LAB_00db0fbd;
  case SmallStringKind:
    __s = (char *)*(this->LHS).decUL;
    sVar1 = (size_t)(uint)(this->LHS).decUL[1];
    goto LAB_00db0fbd;
  }
  sVar1 = 0;
LAB_00db0fbd:
  SVar2.Length = sVar1;
  SVar2.Data = __s;
  return SVar2;
}

Assistant:

StringRef getSingleStringRef() const {
      assert(isSingleStringRef() &&"This cannot be had as a single stringref!");
      switch (getLHSKind()) {
      default: llvm_unreachable("Out of sync with isSingleStringRef");
      case EmptyKind:      return StringRef();
      case CStringKind:    return StringRef(LHS.cString);
      case StdStringKind:  return StringRef(*LHS.stdString);
      case StringRefKind:  return *LHS.stringRef;
      case SmallStringKind:
        return StringRef(LHS.smallString->data(), LHS.smallString->size());
      }
    }